

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall SimpleASTNode::eval(SimpleASTNode *this,int level)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  _Atomic_word *p_Var5;
  string *psVar6;
  ostream *poVar7;
  string *psVar8;
  undefined4 in_register_00000034;
  _Elt_pointer psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  int iVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar12;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *__range1;
  list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_> *plVar13;
  _List_node_base *p_Var14;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c0 [8];
  stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
  tmp;
  undefined1 auStack_68 [8];
  Ptr result;
  Ptr child1;
  undefined1 local_40 [8];
  Ptr child2;
  
  tmp.c.
  super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)CONCAT44(in_register_00000034,level);
  plVar13 = &this->m_childList;
  p_Var14 = (this->m_childList).
            super__List_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (level == 0) {
    if (p_Var14 == (_List_node_base *)plVar13) {
      if (this->m_type == INT_LITERAL) {
        psVar8 = (string *)&this->m_text;
        poVar7 = (ostream *)&std::cout;
      }
      else {
        if (this->m_type != ID) {
          return;
        }
        psVar6 = &this->m_text;
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&m_varMap_abi_cxx11_._M_h,psVar6);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
          poVar7 = std::operator<<(poVar7,(string *)psVar6);
          std::operator<<(poVar7,"\'");
          return;
        }
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)psVar6);
        poVar7 = std::operator<<(poVar7,": ");
        psVar8 = (string *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28);
      }
      std::operator<<(poVar7,psVar8);
      return;
    }
  }
  else if (p_Var14 == (_List_node_base *)plVar13) {
    return;
  }
  for (; p_Var14 != (_List_node_base *)plVar13; p_Var14 = p_Var14->_M_next) {
    eval((SimpleASTNode *)p_Var14[1]._M_next,level + 1);
    if (*(int *)&(p_Var14[1]._M_next)->_M_next - 1U < 2) {
      std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
      push_back(&m_evalStack.c,(value_type *)(p_Var14 + 1));
    }
  }
  if (this->m_type - ADDITIVE_EXP < 2) {
    psVar9 = m_evalStack.c.
             super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar9 = m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               &psVar9[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar9 = m_evalStack.c.
             super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar9 = m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    this_00 = &result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               &psVar9[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (*(int *)&(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base == 1) {
      p_Var5 = &(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count;
LAB_0010a1dc:
      uVar1 = atoi(*(char **)p_Var5);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar1;
    }
    else if (*(int *)&(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base == 2) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&m_varMap_abi_cxx11_._M_h,
                     (key_type *)
                     &(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
        poVar7 = std::operator<<(poVar7,(string *)
                                        &(result.
                                          super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count);
        std::operator<<(poVar7,"\'");
        goto LAB_0010a36a;
      }
      p_Var5 = (_Atomic_word *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28);
      goto LAB_0010a1dc;
    }
    if (*(ASTNodeType *)local_40 == INT_LITERAL) {
      psVar6 = (string *)((long)local_40 + 8);
LAB_0010a21d:
      uVar1 = atoi((psVar6->_M_dataplus)._M_p);
      plVar13 = (list<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                 *)(ulong)uVar1;
    }
    else if (*(ASTNodeType *)local_40 == ID) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&m_varMap_abi_cxx11_._M_h,(string *)((long)local_40 + 8));
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Undefined var \'");
        poVar7 = std::operator<<(poVar7,(string *)((long)local_40 + 8));
        std::operator<<(poVar7,"\'");
        goto LAB_0010a36a;
      }
      psVar6 = (string *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x28);
      goto LAB_0010a21d;
    }
    auStack_68 = (undefined1  [8])0x0;
    result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    psVar6 = &this->m_text;
    iVar2 = std::__cxx11::string::compare((char *)psVar6);
    iVar11 = (int)this_00;
    iVar12 = (int)plVar13;
    if (iVar2 == 0) {
      iVar2 = iVar12 * iVar11;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar2 == 0) {
        iVar2 = (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | (ulong)this_00 & 0xffffffff) /
                     (long)iVar12);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar2 == 0) {
          iVar2 = iVar12 + iVar11;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar6);
          iVar2 = 0;
          if (iVar3 == 0) {
            iVar2 = iVar11 - iVar12;
          }
        }
      }
    }
    child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1
    ;
    std::__cxx11::to_string((string *)local_c0,iVar2);
    std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
              ((ASTNodeType *)&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4));
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,&local_d0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    std::__cxx11::string::~string((string *)local_c0);
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    push_back(&m_evalStack.c,(value_type *)auStack_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
  }
  else {
    if (this->m_type != ASSIGMENT) goto LAB_0010a37c;
    psVar9 = m_evalStack.c.
             super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar9 = m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               &psVar9[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    psVar9 = m_evalStack.c.
             super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        m_evalStack.c.
        super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar9 = m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &psVar9[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    pop_back(&m_evalStack.c);
    if (*(int *)&(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base == 2) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(result.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count,(string *)((long)local_40 + 8));
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&m_varMap_abi_cxx11_,local_c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_c0);
    }
  }
LAB_0010a36a:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
LAB_0010a37c:
  if ((int)tmp.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node == 0) {
    std::
    stack<std::shared_ptr<SimpleASTNode>,std::deque<std::shared_ptr<SimpleASTNode>,std::allocator<std::shared_ptr<SimpleASTNode>>>>
    ::
    stack<std::deque<std::shared_ptr<SimpleASTNode>,std::allocator<std::shared_ptr<SimpleASTNode>>>,void>
              ((stack<std::shared_ptr<SimpleASTNode>,_std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>_>
                *)local_c0);
    while (m_evalStack.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           m_evalStack.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      psVar9 = m_evalStack.c.
               super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (m_evalStack.c.
          super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          m_evalStack.c.
          super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar9 = m_evalStack.c.
                 super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 &psVar9[-1].super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>);
      std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
      pop_back(&m_evalStack.c);
      std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
      push_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                 *)local_c0,(value_type *)local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
    }
    while (tmp.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node !=
           (_Map_pointer)
           tmp.c.
           super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size) {
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                tmp.c.
                super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      if ((_Elt_pointer)
          tmp.c.
          super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node ==
          tmp.c.
          super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        p_Var10 = tmp.c.
                  super__Deque_base<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                  super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
                  0x20;
      }
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)(p_Var10 + -1));
      std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
      pop_back((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
                *)local_c0);
      std::operator<<((ostream *)&std::cout,(string *)((long)local_40 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
    }
    std::deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>::
    ~deque((deque<std::shared_ptr<SimpleASTNode>,_std::allocator<std::shared_ptr<SimpleASTNode>_>_>
            *)local_c0);
  }
  return;
}

Assistant:

void SimpleASTNode::eval(int level)
{
    //Recursive ending condition
    if (level && m_childList.empty())
        return;
    else if (!level && m_childList.empty()) {
        //std::cout << "here";
        if (m_type == ASTNodeType::ID) {
            auto search = m_varMap.find(m_text);
            if (search != m_varMap.end()) {
                std::cout << m_text << ": " << search->second;
            } else {
                std::cout << "Undefined var \'" << m_text << "\'";
            }            
        } else if (m_type == ASTNodeType::INT_LITERAL) {
            std::cout << m_text;
        }
        return;
    }
    for (auto& item : m_childList) {
        item->eval(level + 1);
        if (item->m_type == ASTNodeType::ID || item->m_type == ASTNodeType::INT_LITERAL) {
            m_evalStack.push(item);
        }
    }
    switch (m_type) {
        case ASTNodeType::DECLARATION:
            break;
        case ASTNodeType::MULTIL_EXP:
        case ASTNodeType::ADDITIVE_EXP:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            int iChild1;
            int iChild2;
            if (child1->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child1->m_text);
                if (search != m_varMap.end()) {
                    iChild1 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child1->m_text << "\'";
                    break;
                }
            } else if (child1->m_type == ASTNodeType::INT_LITERAL) {
                iChild1 = atoi((child1->m_text).c_str());
            }
            if (child2->m_type == ASTNodeType::ID) {
                auto search = m_varMap.find(child2->m_text);
                if (search != m_varMap.end()) {
                    iChild2 = atoi((search->second).c_str());
                } else {
                    std::cout << "Undefined var \'" << child2->m_text << "\'";
                    break;
                }
            } else if (child2->m_type == ASTNodeType::INT_LITERAL) {
                iChild2 = atoi((child2->m_text).c_str());
            }
            int iResult = 0;
            SimpleASTNode::Ptr result;
            if (!m_text.compare({"*"})) {
                iResult = iChild1 * iChild2;
            } else if (!m_text.compare({"/"})) {
                iResult = iChild1 / iChild2;
            } else if (!m_text.compare({"+"})) {
                iResult = iChild1 + iChild2;
            } else if (!m_text.compare({"-"})) {
                iResult = iChild1 - iChild2;
            }
            result = SimpleASTNode::create(ASTNodeType::INT_LITERAL, std::to_string(iResult));
            m_evalStack.push(result);            
        }
            break;      
        case ASTNodeType::ASSIGMENT:
        {
            SimpleASTNode::Ptr child2 = m_evalStack.top();
            m_evalStack.pop();
            SimpleASTNode::Ptr child1 = m_evalStack.top();
            m_evalStack.pop();
            if (child1->m_type == ASTNodeType::ID) {
                m_varMap.insert({child1->m_text, child2->m_text});
            }
        }   
            break;
        default:
            break;     
    }

    //Handle the final results
    if (!level) {
        std::stack<SimpleASTNode::Ptr> tmp;
        while (!m_evalStack.empty()) {
            SimpleASTNode::Ptr node = m_evalStack.top();
            m_evalStack.pop();
            tmp.push(node);
        }
        while (!tmp.empty()) {
            SimpleASTNode::Ptr node = tmp.top();
            tmp.pop();
            std::cout << node->m_text;
        }
    }
}